

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O0

AutoFile * __thiscall
AutoFile::operator>>
          (AutoFile *this,
          Wrapper<VectorFormatter<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>_>,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_&>
          *obj)

{
  long lVar1;
  AutoFile *in_RDI;
  long in_FS_OFFSET;
  AutoFile *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Unserialize<AutoFile,_Wrapper<VectorFormatter<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>_>,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_&>_&>
            (in_stack_ffffffffffffffd8,
             (Wrapper<VectorFormatter<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>_>,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_&>
              *)0x4f0840);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

AutoFile& operator>>(T&& obj)
    {
        ::Unserialize(*this, obj);
        return *this;
    }